

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

string * __thiscall
llvm::StringRef::upper_abi_cxx11_(string *__return_storage_ptr__,StringRef *this)

{
  ulong uVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  size_type e;
  size_type i;
  StringRef *local_28;
  StringRef *this_local;
  string *Result;
  StringRef *local_10;
  
  i._7_1_ = 0;
  uVar1 = this->Length;
  local_28 = this;
  this_local = (StringRef *)__return_storage_ptr__;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,uVar1,'\0',(allocator *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  e = 0;
  sVar2 = this->Length;
  Result = (string *)this;
  for (; e != sVar2; e = e + 1) {
    cVar3 = toUpper(this->Data[e]);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar4 = cVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringRef::upper() const {
  std::string Result(size(), char());
  for (size_type i = 0, e = size(); i != e; ++i) {
    Result[i] = toUpper(Data[i]);
  }
  return Result;
}